

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

Path * find_path(Path *__return_storage_ptr__,Grid *grid)

{
  NodeList *this;
  int iVar1;
  int iVar2;
  int iVar3;
  GridNode *pGVar4;
  uint uVar5;
  NODE_STATE NVar6;
  GridNode *pGVar7;
  GridNode *pGVar8;
  GridNode **ppGVar9;
  long *plVar10;
  ostream *poVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  bool bVar18;
  Heap openList;
  Heap closedList;
  Heap local_60;
  Heap local_50;
  GridNode *local_40;
  Path *local_38;
  
  local_38 = __return_storage_ptr__;
  pGVar7 = Grid::get_start_node(grid);
  pGVar8 = Grid::get_target_node(grid);
  local_60.maxCount = 0xe1;
  ppGVar9 = (GridNode **)operator_new__(0x708);
  iVar17 = 0;
  local_60.count = 0;
  local_50.maxCount = 0xe1;
  local_60.list = ppGVar9;
  local_50.list = (GridNode **)operator_new__(0x708);
  local_50.count = 0;
  pGVar7->index = 0;
  *ppGVar9 = pGVar7;
  local_40 = pGVar7;
  Heap::sort_up(&local_60,pGVar7);
  iVar2 = local_60.count + 1;
  bVar18 = -1 < local_60.count;
  local_60.count = iVar2;
  if (bVar18) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      pGVar7 = *local_60.list;
      lVar13 = (long)local_60.count;
      local_60.count = local_60.count + -1;
      *local_60.list = local_60.list[lVar13 + -1];
      pGVar4 = *local_60.list;
      pGVar4->index = 0;
      Heap::sort_down(&local_60,pGVar4);
      pGVar7->index = local_50.count;
      local_50.list[local_50.count] = pGVar7;
      Heap::sort_up(&local_50,pGVar7);
      local_50.count = local_50.count + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Node:",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pGVar7->pos).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(pGVar7->pos).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if (pGVar7 == pGVar8) break;
      if (0 < pGVar7->neighbourCount) {
        lVar13 = 0;
        do {
          pGVar4 = (pGVar7->neighbours).super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar13];
          NVar6 = pGVar4->state;
          if ((NVar6 != BLOCKED) &&
             ((local_50.count < 1 || (local_50.list[pGVar4->index] != pGVar4)))) {
            iVar2 = (pGVar4->pos).x;
            iVar3 = (pGVar4->pos).y;
            uVar12 = (pGVar7->pos).x - iVar2;
            uVar5 = -uVar12;
            if (0 < (int)uVar12) {
              uVar5 = uVar12;
            }
            uVar15 = (pGVar7->pos).y - iVar3;
            uVar12 = -uVar15;
            if (0 < (int)uVar15) {
              uVar12 = uVar15;
            }
            uVar15 = uVar12;
            if (uVar5 < uVar12) {
              uVar15 = uVar5;
            }
            lVar16 = (ulong)uVar5 - (ulong)uVar12;
            lVar14 = -lVar16;
            if (0 < lVar16) {
              lVar14 = lVar16;
            }
            iVar1 = uVar15 * 0xe + pGVar7->gCost + (int)lVar14 * 10;
            if ((((long)local_60.count < 1) || (local_60.list[pGVar4->index] != pGVar4)) ||
               (iVar1 < pGVar4->gCost)) {
              pGVar4->gCost = iVar1;
              uVar12 = (pGVar8->pos).x - iVar2;
              uVar5 = -uVar12;
              if (0 < (int)uVar12) {
                uVar5 = uVar12;
              }
              uVar15 = (pGVar8->pos).y - iVar3;
              uVar12 = -uVar15;
              if (0 < (int)uVar15) {
                uVar12 = uVar15;
              }
              uVar15 = uVar12;
              if (uVar5 < uVar12) {
                uVar15 = uVar5;
              }
              lVar16 = (ulong)uVar5 - (ulong)uVar12;
              lVar14 = -lVar16;
              if (0 < lVar16) {
                lVar14 = lVar16;
              }
              pGVar4->hCost = uVar15 * 0xe + (int)lVar14 * 10;
              pGVar4->parent = pGVar7;
              if ((local_60.count < 1) || (local_60.list[pGVar4->index] != pGVar4)) {
                if (pGVar4 != pGVar8) {
                  NVar6 = NEIGHBOUR;
                }
                pGVar4->state = NVar6;
                pGVar4->index = local_60.count;
                local_60.list[local_60.count] = pGVar4;
                Heap::sort_up(&local_60,pGVar4);
                local_60.count = local_60.count + 1;
              }
              else {
                Heap::sort_up(&local_60,pGVar4);
              }
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pGVar7->neighbourCount);
      }
      if (pGVar7 != local_40) {
        pGVar7->state = CHECKED;
      }
      iVar17 = iVar17 + 1;
    } while (0 < local_60.count);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path Found!!!",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_38->number = 0;
  (local_38->grids).count = 0;
  (local_38->grids).capacity = 0;
  pGVar7 = pGVar8->parent;
  if (pGVar7 != local_40) {
    this = &local_38->grids;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path Node:",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pGVar7->pos).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(pGVar7->pos).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      NodeList::add_node(this,pGVar7);
      pGVar7 = pGVar7->parent;
      local_38->number = local_38->number + 1;
    } while (pGVar7 != local_40);
  }
  return local_38;
}

Assistant:

Path find_path(Grid *grid)
{
    // Setup nodes
    GridNode *startNode = grid->get_start_node();
    GridNode *targetNode = grid->get_target_node();

    // Calculate Path

#if USE_HEAPS
    Heap openList;
    Heap closedList;
    openList.add_to_heap(startNode);
#else
    NodeList openList;
    NodeList closedList;
    openList.add_node(startNode);
#endif
    int iteration = 0;
    while (openList.count > 0)
    {
        std::cout << "Iteration: " << iteration << std::endl;
        iteration++;
// Find Current Node
#if USE_HEAPS
        GridNode *currentNode = openList.remove_first();
        closedList.add_to_heap(currentNode);
#else
        GridNode *currentNode = openList.get_current_node();
        openList.remove_node(currentNode);
        closedList.add_node(currentNode);
#endif
        std::cout << "Current Node:"
                  << "(" << currentNode->pos.x << "," << currentNode->pos.y << ")" << std::endl;
        if (currentNode == targetNode)
        {
            break;
        }
        // Check Neighbours
        for (int i = 0; i < currentNode->neighbourCount; i++)
        {
            GridNode *neighbour = currentNode->neighbours[i];
            if (neighbour->is_traversable() && !closedList.has_node(neighbour))
            {
                int moveCost = currentNode->gCost + get_distance_bw_nodes(currentNode, neighbour);
                if (!openList.has_node(neighbour) || moveCost < neighbour->gCost)
                {
                    neighbour->gCost = moveCost;
                    neighbour->hCost = get_distance_bw_nodes(targetNode, neighbour);
                    neighbour->parent = currentNode;
                    if (!openList.has_node(neighbour))
                    {
                        neighbour->state = (neighbour != targetNode) ? NEIGHBOUR : neighbour->state;
#if USE_HEAPS
                        openList.add_to_heap(neighbour);
#else
                        openList.add_node(neighbour);
#endif
                    }
                    else
                    {
#if USE_HEAPS
                        openList.update_item(neighbour);
#else
                        set_cost(neighbour, startNode, targetNode);
#endif
                    }
                }
            }
        }
        if (currentNode != startNode)
        {
            currentNode->state = CHECKED;
        }
    }
    std::cout << "Path Found!!!" << std::endl;

    // Setup Path
    Path p;
    GridNode *node = targetNode->parent;
    while (node != startNode)
    {
        std::cout << "Path Node:"
                  << "(" << node->pos.x << "," << node->pos.y << ")" << std::endl;
        p.grids.add_node(node);
        node = node->parent;
        p.number++;
    }
    return p;
}